

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameCollaborativeGraphical.cpp
# Opt level: O2

void __thiscall
BayesianGameCollaborativeGraphical::SanityCheckBGCG(BayesianGameCollaborativeGraphical *this)

{
  bool bVar1;
  uint uVar2;
  const_reference ppBVar3;
  ostream *poVar4;
  
  for (uVar2 = 0; (ulong)uVar2 < this->_m_nrLRFs; uVar2 = uVar2 + 1) {
    ppBVar3 = std::
              vector<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_>
              ::at(&this->_m_LRFs,(ulong)uVar2);
    (*((*ppBVar3)->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
      super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
      _vptr_Interface_ProblemToPolicyDiscrete[0xf])();
  }
  bVar1 = IsFullyConnected(this);
  if (bVar1) {
    return;
  }
  poVar4 = std::operator<<((ostream *)&std::cout,
                           "Warning: BayesianGameCollaborativeGraphical is not fully connected");
  std::endl<char,std::char_traits<char>>(poVar4);
  return;
}

Assistant:

void BayesianGameCollaborativeGraphical::SanityCheckBGCG() const
{
    for(Index e=0; e < _m_nrLRFs; e++)
        _m_LRFs.at(e)->SanityCheck();

    if(!IsFullyConnected())
        cout << "Warning: BayesianGameCollaborativeGraphical is not fully connected"  << endl;
}